

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutazione.cpp
# Opt level: O3

void __thiscall Permutazione::somma(Permutazione *this,Permutazione *p)

{
  ushort uVar1;
  unsigned_short *puVar2;
  unsigned_short *puVar3;
  ulong uVar4;
  unsigned_short *puVar5;
  
  uVar1 = this->dimensione;
  puVar3 = (unsigned_short *)operator_new__((ulong)((uint)uVar1 + (uint)uVar1));
  if (uVar1 == 0) {
    puVar5 = this->individuo;
    if (puVar5 == (unsigned_short *)0x0) goto LAB_00104875;
  }
  else {
    puVar2 = p->individuo;
    puVar5 = this->individuo;
    uVar4 = 0;
    do {
      puVar3[uVar4] = puVar2[puVar5[uVar4]];
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  operator_delete__(puVar5);
LAB_00104875:
  this->individuo = puVar3;
  return;
}

Assistant:

void Permutazione::somma(Permutazione* p) {

	unsigned short* individuo = new unsigned short[dimensione];

	for (unsigned short k = 0; k < dimensione; k++) {
		individuo[k] = p->individuo[this->individuo[k]];
	}

	delete[] this->individuo;
	this->individuo = individuo;
}